

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O0

void __thiscall
LiteScript::Namer::Save(Namer *this,ostream *stream,Namer *namer,offset_in_Memory_to_subr caller)

{
  Object *pOVar1;
  Variable *this_00;
  size_type sVar2;
  reference this_01;
  long *plVar3;
  Namer *local_b0;
  Namer *local_80;
  Namer *local_58;
  uint local_3c;
  uint sz;
  uint i;
  offset_in_Memory_to_subr caller_local;
  Namer *namer_local;
  ostream *stream_local;
  
  pOVar1 = Variable::operator->((Variable *)stream);
  plVar3 = (long *)((long)(pOVar1->memory->arr)._M_elems + caller);
  local_58 = namer;
  if (((ulong)namer & 1) != 0) {
    local_58 = *(Namer **)((namer->current).data + *plVar3 + -0x11);
  }
  pOVar1 = Variable::operator->((Variable *)stream);
  (*(code *)local_58)(plVar3,this,pOVar1->ID);
  pOVar1 = Variable::operator->((Variable *)stream);
  plVar3 = (long *)((long)(pOVar1->memory->arr)._M_elems + caller);
  local_80 = namer;
  if (((ulong)namer & 1) != 0) {
    local_80 = *(Namer **)((namer->current).data + *plVar3 + -0x11);
  }
  this_00 = Nullable<LiteScript::Variable>::operator*
                      ((Nullable<LiteScript::Variable> *)(stream + 0x10));
  pOVar1 = Variable::operator->(this_00);
  (*(code *)local_80)(plVar3,this,pOVar1->ID);
  sVar2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                     (stream + 0x30));
  OStreamer::Write<unsigned_int>((ostream *)this,(uint)sVar2);
  local_3c = 0;
  sVar2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                     (stream + 0x30));
  for (; local_3c < (uint)sVar2; local_3c = local_3c + 1) {
    pOVar1 = Variable::operator->((Variable *)stream);
    plVar3 = (long *)((long)(pOVar1->memory->arr)._M_elems + caller);
    local_b0 = namer;
    if (((ulong)namer & 1) != 0) {
      local_b0 = *(Namer **)((namer->current).data + *plVar3 + -0x11);
    }
    this_01 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                        ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                         (stream + 0x30),(ulong)local_3c);
    pOVar1 = Variable::operator->(this_01);
    (*(code *)local_b0)(plVar3,this,pOVar1->ID);
  }
  return;
}

Assistant:

void LiteScript::Namer::Save(std::ostream &stream, Namer &namer, bool (Memory::*caller)(std::ostream&, unsigned int)) {
    (namer.global->memory.*caller)(stream, namer.global->ID);
    (namer.global->memory.*caller)(stream, (*namer.current)->ID);
    OStreamer::Write<unsigned int>(stream, namer.heap.size());
    for (unsigned int i = 0, sz = namer.heap.size(); i < sz; i++)
        (namer.global->memory.*caller)(stream, namer.heap[i]->ID);
}